

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<4>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<4> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  int MT_00;
  int MT;
  int local_84;
  int local_80;
  int local_7c;
  StructureDivision local_78;
  
  MT_00 = (this->super_Base).MT_;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (double)(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.
                 atomicWeightRatio_;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl =
       (long)(char)*(__index_type *)
                    ((long)&(this->distributions_).
                            super__Variant_base<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                            .
                            super__Move_assign_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                            .
                            super__Copy_assign_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                            .
                            super__Move_ctor_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                            .
                            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                            .
                            super__Variant_storage_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                    + 0xf0);
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_84 = MT_00;
  local_80 = MF;
  local_7c = MAT;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_78,it,MAT,MF,MT_00);
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.
                 atomicWeightRatio_;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)(*(__index_type *)
               ((long)&(this->distributions_).
                       super__Variant_base<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                       .
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
               + 0xf0) == '\0');
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)*(int *)&(this->super_Base).field_0x14;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_78,it,MAT,MF,MT_00);
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)&local_7c;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_80;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&local_84;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)it;
  std::
  visit<njoy::ENDFtk::section::Type<4>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<4>::Isotropic,njoy::ENDFtk::section::Type<4>::LegendreDistributions,njoy::ENDFtk::section::Type<4>::TabulatedDistributions,njoy::ENDFtk::section::Type<4>::MixedDistributions>const&>
            ((anon_class_32_4_f17ee1e6 *)&local_78,&this->distributions_);
  sectionEndRecord(&local_78,local_7c,local_80);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(), 0, this->LTT(),
                 0, 0 ).print( it, MAT, MF, MT );
  ControlRecord( 0, this->AWR(), this->LI(), this->LCT(),
                 0, 0 ).print( it, MAT, MF, MT );
  std::visit( [&] ( const auto& v ) { return v.print( it, MAT, MF, MT ); },
              this->distributions_ );
  SEND( MAT, MF ).print( it );
}